

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  uint8_t *puVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  char *pcVar9;
  size_t sVar10;
  uint8_t *in;
  uint8_t *puVar11;
  ulong uVar12;
  size_t sVar13;
  uint i;
  size_t key_len;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  uint8_t salt [18];
  uint8_t key [12];
  byte local_a8 [32];
  archive_hmac_sha1_ctx *local_88;
  code *local_80;
  undefined8 local_78;
  undefined1 local_6d;
  uint8_t auStack_68 [56];
  
  pvVar3 = a->format_data;
  if ((long)*(size_t *)((long)pvVar3 + 0x28) < (long)s) {
    s = *(size_t *)((long)pvVar3 + 0x28);
  }
  *(long *)((long)pvVar3 + 0x20) = *(long *)((long)pvVar3 + 0x20) + s;
  if (s == 0) {
    return 0;
  }
  if ((*(byte *)((long)pvVar3 + 0x44) & 1) == 0) {
LAB_0017fb91:
    if (*(int *)((long)pvVar3 + 0x3c) == 8) {
      *(void **)((long)pvVar3 + 0x140) = buff;
      *(int *)((long)pvVar3 + 0x148) = (int)s;
      do {
        iVar7 = cm_zlib_deflate((z_streamp)((long)pvVar3 + 0x140),0);
        if (iVar7 == -2) {
          return -0x1e;
        }
        if (*(int *)((long)pvVar3 + 0x160) == 0) {
          if (*(char *)((long)pvVar3 + 0x5c) == '\0') {
            if (*(char *)((long)pvVar3 + 0xc0) != '\0') {
              local_78 = *(size_t *)((long)pvVar3 + 0x1b0);
              iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x68),
                                     *(uint8_t **)((long)pvVar3 + 0x1b8),local_78,
                                     *(uint8_t **)((long)pvVar3 + 0x1b8),&local_78);
              if (iVar7 < 0) {
                archive_set_error(&a->archive,-1,"Failed to encrypt file");
                return -0x19;
              }
              __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 200),
                                 *(uint8_t **)((long)pvVar3 + 0x1b8),
                                 *(size_t *)((long)pvVar3 + 0x1b0));
            }
          }
          else {
            trad_enc_encrypt_update
                      ((trad_enc_ctx *)((long)pvVar3 + 0x50),*(uint8_t **)((long)pvVar3 + 0x1b8),
                       *(size_t *)((long)pvVar3 + 0x1b0),*(uint8_t **)((long)pvVar3 + 0x1b8),
                       *(size_t *)((long)pvVar3 + 0x1b0));
          }
          iVar7 = __archive_write_output
                            (a,*(void **)((long)pvVar3 + 0x1b8),*(size_t *)((long)pvVar3 + 0x1b0));
          if (iVar7 != 0) goto LAB_0017feba;
          lVar14 = *(long *)((long)pvVar3 + 0x1b0);
          *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + lVar14;
          *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + lVar14;
          *(undefined8 *)((long)pvVar3 + 0x158) = *(undefined8 *)((long)pvVar3 + 0x1b8);
          *(int *)((long)pvVar3 + 0x160) = (int)lVar14;
        }
      } while (*(int *)((long)pvVar3 + 0x148) != 0);
    }
    else {
      if (*(int *)((long)pvVar3 + 0x3c) != 0) {
        archive_set_error(&a->archive,-1,"Invalid ZIP compression type");
        return -0x1e;
      }
      if ((*(char *)((long)pvVar3 + 0x5c) == '\0') && (*(char *)((long)pvVar3 + 0xc0) == '\0')) {
        iVar7 = __archive_write_output(a,buff,s);
        if (iVar7 != 0) goto LAB_0017feba;
        *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + s;
        *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + s;
      }
      else {
        puVar1 = (uint8_t *)((long)buff + s);
        local_80 = __hmac_sha1_update;
        local_88 = (archive_hmac_sha1_ctx *)((long)pvVar3 + 200);
        puVar11 = (uint8_t *)buff;
        pvVar15 = buff;
        do {
          in = puVar11;
          if (puVar1 <= in) break;
          if (*(char *)((long)pvVar3 + 0x5c) == '\0') {
            local_78 = *(size_t *)((long)pvVar3 + 0x1b0);
            iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x68),in,
                                   (long)puVar1 - (long)in,*(uint8_t **)((long)pvVar3 + 0x1b8),
                                   &local_78);
            if (-1 < iVar7) {
              (*local_80)(local_88,*(uint8_t **)((long)pvVar3 + 0x1b8),local_78);
              goto LAB_0017fc8d;
            }
            archive_set_error(&a->archive,-1,"Failed to encrypt file");
            pvVar15 = (void *)0xffffffffffffffe7;
LAB_0017fce2:
            bVar4 = false;
            puVar11 = in;
          }
          else {
            uVar6 = trad_enc_encrypt_update
                              ((trad_enc_ctx *)((long)pvVar3 + 0x50),in,(long)puVar1 - (long)in,
                               *(uint8_t **)((long)pvVar3 + 0x1b8),*(size_t *)((long)pvVar3 + 0x1b0)
                              );
            local_78 = (size_t)uVar6;
LAB_0017fc8d:
            iVar7 = __archive_write_output(a,*(void **)((long)pvVar3 + 0x1b8),local_78);
            if (iVar7 != 0) {
              pvVar15 = (void *)(long)iVar7;
              goto LAB_0017fce2;
            }
            *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + local_78;
            *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + local_78;
            puVar11 = in + local_78;
            bVar4 = true;
          }
        } while (bVar4);
        if (in < puVar1) {
          return (ssize_t)pvVar15;
        }
      }
    }
    *(long *)((long)pvVar3 + 0x28) = *(long *)((long)pvVar3 + 0x28) - s;
    if ((*(char *)((long)pvVar3 + 0xc0) == '\0') || (*(int *)((long)pvVar3 + 0x60) != 2)) {
      uVar8 = (**(code **)((long)pvVar3 + 0xe8))
                        (*(undefined4 *)((long)pvVar3 + 0x38),buff,s & 0xffffffff);
      *(undefined4 *)((long)pvVar3 + 0x38) = uVar8;
    }
  }
  else {
    if (1 < *(int *)((long)pvVar3 + 0x40) - 2U) {
      if ((*(int *)((long)pvVar3 + 0x40) == 1) && (*(char *)((long)pvVar3 + 0x5c) == '\0')) {
        pcVar9 = __archive_write_get_passphrase(a);
        if (pcVar9 == (char *)0x0) {
          archive_set_error(&a->archive,-1,"Encryption needs passphrase");
          iVar7 = -0x19;
        }
        else {
          iVar7 = archive_random(&local_78,0xb);
          if (iVar7 == 0) {
            sVar10 = strlen(pcVar9);
            *(undefined8 *)((long)pvVar3 + 0x50) = 0x2345678912345678;
            *(undefined4 *)((long)pvVar3 + 0x58) = 0x34567890;
            if (sVar10 != 0) {
              sVar13 = 0;
              do {
                trad_enc_update_keys((trad_enc_ctx *)((long)pvVar3 + 0x50),pcVar9[sVar13]);
                sVar13 = sVar13 + 1;
              } while (sVar10 != sVar13);
            }
            local_6d = *(undefined1 *)((long)pvVar3 + 0x5d);
            lVar14 = 0;
            do {
              uVar6 = *(uint *)((long)pvVar3 + 0x58) | 2;
              local_a8[lVar14] =
                   (byte)((uVar6 ^ 1) * uVar6 >> 8) ^ *(byte *)((long)&local_78 + lVar14);
              trad_enc_update_keys
                        ((trad_enc_ctx *)((long)pvVar3 + 0x50),*(byte *)((long)&local_78 + lVar14));
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0xc);
            iVar7 = __archive_write_output(a,local_a8,0xc);
            if (iVar7 == 0) {
              *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + 0xc;
              *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + 0xc;
              iVar7 = 0;
            }
          }
          else {
            archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
            iVar7 = -0x1e;
          }
        }
        if (iVar7 != 0) goto LAB_0017feba;
        *(undefined1 *)((long)pvVar3 + 0x5c) = 1;
      }
      goto LAB_0017fb91;
    }
    if (*(char *)((long)pvVar3 + 0xc0) != '\0') goto LAB_0017fb91;
    pcVar9 = __archive_write_get_passphrase(a);
    if (pcVar9 == (char *)0x0) {
      archive_set_error(&a->archive,-1,"Encryption needs passphrase");
      iVar7 = -0x19;
    }
    else {
      iVar7 = *(int *)((long)pvVar3 + 0x40);
      lVar14 = (ulong)(iVar7 != 2) * 8;
      uVar16 = lVar14 + 8;
      iVar5 = archive_random(local_a8,uVar16);
      if (iVar5 == 0) {
        key_len = (ulong)(iVar7 != 2) * 0x10 + 0x10;
        sVar10 = strlen(pcVar9);
        uVar12 = (ulong)(uint)((int)key_len * 2);
        pbkdf2_sha1(pcVar9,sVar10,local_a8,uVar16,1000,(uint8_t *)&local_78,uVar12 | 2);
        iVar5 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar3 + 0x68),(uint8_t *)&local_78,
                             key_len);
        if (iVar5 == 0) {
          iVar5 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar3 + 200),
                                   auStack_68 + (ulong)(iVar7 != 2) * 0x10,key_len);
          if (iVar5 == 0) {
            bVar2 = *(byte *)((long)&local_78 + uVar12 + 1);
            local_a8[(ulong)(iVar7 != 2) * 8 + 8] = *(byte *)((long)&local_78 + uVar12);
            local_a8[lVar14 + 9] = bVar2;
            uVar16 = uVar16 | 2;
            iVar7 = __archive_write_output(a,local_a8,uVar16);
            if (iVar7 == 0) {
              *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + uVar16;
              *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + uVar16;
              iVar7 = 0;
            }
            goto LAB_0017fb74;
          }
          aes_ctr_release((archive_crypto_ctx *)((long)pvVar3 + 0x68));
          pcVar9 = "Failed to initialize HMAC-SHA1";
        }
        else {
          pcVar9 = "Decryption is unsupported due to lack of crypto library";
        }
        archive_set_error(&a->archive,-1,pcVar9);
        iVar7 = -0x19;
      }
      else {
        archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
        iVar7 = -0x1e;
      }
    }
LAB_0017fb74:
    if (iVar7 == 0) {
      *(undefined1 *)((long)pvVar3 + 0xd0) = 1;
      *(undefined1 *)((long)pvVar3 + 0xc0) = 1;
      goto LAB_0017fb91;
    }
LAB_0017feba:
    s = (size_t)iVar7;
  }
  return s;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
		switch (zip->entry_encryption) {
		case ENCRYPTION_TRADITIONAL:
			/* Initialize traditional PKWARE encryption context. */
			if (!zip->tctx_valid) {
				ret = init_traditional_pkware_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->tctx_valid = 1;
			}
			break;
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			if (!zip->cctx_valid) {
				ret = init_winzip_aes_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->cctx_valid = zip->hctx_valid = 1;
			}
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		if (zip->tctx_valid || zip->cctx_valid) {
			const uint8_t *rb = (const uint8_t *)buff;
			const uint8_t * const re = rb + s;

			while (rb < re) {
				size_t l;

				if (zip->tctx_valid) {
					l = trad_enc_encrypt_update(&zip->tctx,
					    rb, re - rb,
					    zip->buf, zip->len_buf);
				} else {
					l = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    rb, re - rb, zip->buf, &l);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, l);
				}
				ret = __archive_write_output(a, zip->buf, l);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += l;
				zip->written_bytes += l;
				rb += l;
			}
		} else {
			ret = __archive_write_output(a, buff, s);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->written_bytes += s;
			zip->entry_compressed_written += s;
		}
		break;
#if HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
					    zip->buf, zip->len_buf,
					    zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    zip->buf, zip->len_buf,
					    zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.next_out = zip->buf;
				zip->stream.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.avail_in != 0);
		break;
#endif

	case COMPRESSION_UNSPECIFIED:
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	if (!zip->cctx_valid || zip->aes_vendor != AES_VENDOR_AE_2)
		zip->entry_crc32 =
		    zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);

}